

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::log<char_const(&)[45],__0,int&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [45],
               anon_enum_32 *params_1,int *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  anon_enum_32 *params_00;
  int *params_01;
  long lVar3;
  undefined4 in_register_00000034;
  ArrayPtr<kj::String> in_stack_ffffffffffffff88;
  undefined8 uStack_68;
  String local_60;
  String local_48;
  
  str<char_const(&)[45]>
            ((String *)&stack0xffffffffffffff88,(kj *)"failed: expected (SI_USER) == (info.si_code)"
             ,(char (*) [45])CONCAT44(in_register_00000014,severity));
  str<__0&>(&local_60,(kj *)(ulong)*(uint *)CONCAT44(in_register_00000034,line),params_00);
  str<int&>(&local_48,(kj *)CONCAT44(in_register_00000014,severity),params_01);
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,0x35db8f,&stack0xffffffffffffff88,
              in_stack_ffffffffffffff88);
  lVar3 = 0x30;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff88 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff90 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff88 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff90 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&uStack_68 + lVar3))
                (*(undefined8 **)((long)&uStack_68 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}